

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SSAify.cpp
# Opt level: O2

Pass * wasm::createSSAifyNoMergePass(void)

{
  Pass *pPVar1;
  
  pPVar1 = (Pass *)operator_new(0x60);
  pPVar1->runner = (PassRunner *)0x0;
  (pPVar1->name)._M_dataplus._M_p = (pointer)&(pPVar1->name).field_2;
  (pPVar1->name)._M_string_length = 0;
  (pPVar1->name).field_2._M_local_buf[0] = '\0';
  pPVar1->_vptr_Pass = (_func_int **)&PTR__SSAify_00e21708;
  *(undefined1 *)&pPVar1[1]._vptr_Pass = 0;
  pPVar1[1].name._M_string_length = 0;
  pPVar1[1].name.field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&pPVar1[1].name.field_2 + 8) = 0;
  return pPVar1;
}

Assistant:

Pass* createSSAifyNoMergePass() { return new SSAify(false); }